

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcmd.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer *ppbVar6;
  function<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pcVar9;
  ostream *poVar10;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
  *command;
  argument_order order;
  initializer_list<char> short_names;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names;
  char local_8e5;
  int local_8e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  element_type name;
  _Alloc_hider local_758;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_748;
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_730;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  helloCmd;
  type opts;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  _Alloc_hider local_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  _Alloc_hider local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>
  local_550;
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_488;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>
  addCmd;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
  cmd;
  
  opts.super_option_pair<char,__h_,_void>.value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &opts.
             super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&opts,"subcmd hello","");
  paVar3 = &name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  name._M_dataplus._M_p = (pointer)paVar3;
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
                   *)&cmd,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts
                  ,&name);
  paVar4 = &addCmd.m_header.field_2;
  addCmd.m_header._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addCmd,"NAME","");
  nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
  argument<(char)110,std::__cxx11::string>(&helloCmd,&cmd,&addCmd.m_header);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)addCmd.m_header._M_dataplus._M_p != paVar4) {
    operator_delete(addCmd.m_header._M_dataplus._M_p,
                    addCmd.m_header.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &cmd.m_footer.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd.m_footer._M_dataplus._M_p != paVar4) {
    operator_delete(cmd.m_footer._M_dataplus._M_p,cmd.m_footer.field_2._M_allocated_capacity + 1);
  }
  paVar5 = &cmd.m_header.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd.m_header._M_dataplus._M_p != paVar5) {
    operator_delete(cmd.m_header._M_dataplus._M_p,cmd.m_header.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != paVar3) {
    operator_delete(name._M_dataplus._M_p,
                    CONCAT71(name.field_2._M_allocated_capacity._1_7_,name.field_2._M_local_buf[0])
                    + 1);
  }
  if ((option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)opts.super_option_pair<char,__h_,_void>.value.
         super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      &opts.
       super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     ) {
    operator_delete(opts.super_option_pair<char,__h_,_void>.value.
                    super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)((long)&((opts.
                                     super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     .value.
                                     super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->
                                   super_option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).value.
                                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 1));
  }
  name._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"subcmd add","");
  local_800.m_header._M_dataplus._M_p = (pointer)&local_800.m_header.field_2;
  local_800.m_header._M_string_length = 0;
  local_800.m_header.field_2._M_local_buf[0] = '\0';
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
                   *)&opts,&name,&local_800.m_header);
  paVar1 = &local_8e0.field_2;
  local_8e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e0,"LHS","");
  local_8e4 = argc;
  nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
  argument<(char)108,int>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>_>_>
              *)&cmd,&opts,&local_8e0);
  paVar2 = &local_8c0.field_2;
  local_8c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"RHS","");
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>>>
  ::argument<(char)114,int>(&addCmd,&cmd,&local_8c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_8c0._M_dataplus._M_p,
                    CONCAT71(local_8c0.field_2._M_allocated_capacity._1_7_,
                             local_8c0.field_2._M_local_buf[0]) + 1);
  }
  if (cmd.m_flags.
      super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>
      .
      super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_false>
      ._M_head_impl.placeholder._M_string_length != 0) {
    ppbVar6 = (pointer *)
              ((long)&cmd.m_flags.
                      super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>
                      .
                      super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_false>
                      ._M_head_impl.long_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              + 0x10);
    (*(code *)cmd.m_flags.
              super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>
              .
              super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_false>
              ._M_head_impl.placeholder._M_string_length)(ppbVar6,ppbVar6,3);
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)cmd.m_flags.
         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>
         .
         super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_false>
         ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
      &cmd.m_flags.
       super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>
       .
       super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_false>
       ._M_head_impl.long_names) {
    operator_delete(cmd.m_flags.
                    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_false>
                    ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
                    (ulong)((long)&((cmd.m_flags.
                                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>
                                     .
                                     super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_false>
                                     ._M_head_impl.long_names.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd.m_footer._M_dataplus._M_p != paVar4) {
    operator_delete(cmd.m_footer._M_dataplus._M_p,cmd.m_footer.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd.m_header._M_dataplus._M_p != paVar5) {
    operator_delete(cmd.m_header._M_dataplus._M_p,cmd.m_header.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)opts.
         super_option_pair<char,__A_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>_>
         .value.
         super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr != &local_5a8) {
    operator_delete(opts.
                    super_option_pair<char,__A_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>_>
                    .value.
                    super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,local_5a8._M_allocated_capacity + 1);
  }
  if ((option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)opts.super_option_pair<char,__h_,_void>.value.
         super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      &opts.
       super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     ) {
    operator_delete(opts.super_option_pair<char,__h_,_void>.value.
                    super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)((long)&((opts.
                                     super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     .value.
                                     super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->
                                   super_option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).value.
                                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800.m_header._M_dataplus._M_p != &local_800.m_header.field_2) {
    operator_delete(local_800.m_header._M_dataplus._M_p,
                    CONCAT71(local_800.m_header.field_2._M_allocated_capacity._1_7_,
                             local_800.m_header.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != paVar3) {
    operator_delete(name._M_dataplus._M_p,
                    CONCAT71(name.field_2._M_allocated_capacity._1_7_,name.field_2._M_local_buf[0])
                    + 1);
  }
  local_8e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e0,"subcmd","");
  local_8c0._M_string_length = 0;
  local_8c0.field_2._M_local_buf[0] = '\0';
  local_8c0._M_dataplus._M_p = (pointer)paVar2;
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_800,&local_8e0,&local_8c0);
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"hello","");
  local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"hello command","");
  nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
  subcommand<(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
              *)&name,&local_800,&local_820,&local_840,&helloCmd);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"add","");
  local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_880,"add command","");
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>>,std::tuple<>>
  ::
  subcommand<(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
              *)&opts,&name,&local_860,&local_880,&addCmd);
  local_8e5 = 'h';
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"help","");
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"");
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"produce help message","");
  short_names._M_len = 1;
  short_names._M_array = &local_8e5;
  long_names._M_len = 1;
  long_names._M_array = &local_8a0;
  order = flexible;
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>
  ::flag<(char)104,void>(&cmd,&opts,short_names,long_names,&local_798,&local_7b8,exclusive);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
  }
  nonsugar::detail::
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~subcommand(&local_488);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'l',_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'r',_int>_>_>
  ::~basic_command(&local_550);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_p != &local_560) {
    operator_delete(local_570._M_p,local_560._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_p != &local_580) {
    operator_delete(local_590._M_p,local_580._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)opts.
         super_option_pair<char,__A_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>_>
         .value.
         super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr != &local_5a8) {
    operator_delete(opts.
                    super_option_pair<char,__A_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>_>
                    .value.
                    super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,local_5a8._M_allocated_capacity + 1);
  }
  if ((option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)opts.super_option_pair<char,__h_,_void>.value.
         super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      &opts.
       super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     ) {
    operator_delete(opts.super_option_pair<char,__h_,_void>.value.
                    super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)((long)&((opts.
                                     super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     .value.
                                     super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->
                                   super_option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).value.
                                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880._M_dataplus._M_p != &local_880.field_2) {
    operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
  }
  nonsugar::detail::
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~subcommand(&local_730);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_p != &local_748) {
    operator_delete(local_758._M_p,local_748._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != paVar3) {
    operator_delete(name._M_dataplus._M_p,
                    CONCAT71(name.field_2._M_allocated_capacity._1_7_,name.field_2._M_local_buf[0])
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800.m_footer._M_dataplus._M_p != &local_800.m_footer.field_2) {
    operator_delete(local_800.m_footer._M_dataplus._M_p,
                    local_800.m_footer.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800.m_header._M_dataplus._M_p != &local_800.m_header.field_2) {
    operator_delete(local_800.m_header._M_dataplus._M_p,
                    CONCAT71(local_800.m_header.field_2._M_allocated_capacity._1_7_,
                             local_800.m_header.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
    operator_delete(local_8c0._M_dataplus._M_p,
                    CONCAT71(local_8c0.field_2._M_allocated_capacity._1_7_,
                             local_8c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
  }
  nonsugar::
  parse<char*const*,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>>
            (&opts,(nonsugar *)(argv + (0 < local_8e4)),argv + local_8e4,(char **)&cmd,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
              *)0x0,order);
  if (opts.super_option_pair<char,__h_,_void>.value.
      super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    if (opts.
        super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .value.
        super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      if (opts.
          super_option_pair<char,__A_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>_>
          .value.
          super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) goto LAB_0011b0b3;
      nonsugar::
      option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
      ::get<(char)65>((element_type *)&name,&opts);
      poVar10 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)&std::cout,
                           *(int *)CONCAT71(name.field_2._M_allocated_capacity._1_7_,
                                            name.field_2._M_local_buf[0]) +
                           *(int *)name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name._M_string_length;
      if (name.field_2._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name.field_2._8_8_);
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name._M_string_length;
      }
    }
    else {
      peVar8 = ((opts.
                 super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .value.
                 super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->
               super_option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      this = ((opts.
               super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .value.
               super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->
             super_option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      pcVar9 = (peVar8->_M_dataplus)._M_p;
      name._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&name,pcVar9,pcVar9 + peVar8->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, ",7);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != paVar3) {
        operator_delete(name._M_dataplus._M_p,
                        CONCAT71(name.field_2._M_allocated_capacity._1_7_,
                                 name.field_2._M_local_buf[0]) + 1);
      }
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  else {
    nonsugar::
    usage<nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>>
              (&name,(nonsugar *)&cmd,command);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != paVar3) {
      operator_delete(name._M_dataplus._M_p,
                      CONCAT71(name.field_2._M_allocated_capacity._1_7_,name.field_2._M_local_buf[0]
                              ) + 1);
    }
  }
LAB_0011b0b3:
  if (opts.
      super_option_pair<char,__A_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>_>
      .value.
      super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (opts.
               super_option_pair<char,__A_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>_>
               .value.
               super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (opts.
      super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .value.
      super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (opts.
               super_option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .value.
               super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (opts.super_option_pair<char,__h_,_void>.value.
      super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (opts.super_option_pair<char,__h_,_void>.value.
               super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'h',_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'l',_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'r',_int>_>_>_>_>,_std::tuple<>_>
  ::~basic_command(&cmd);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'l',_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'r',_int>_>_>
  ::~basic_command(&addCmd);
  if (helloCmd.m_arguments.
      super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_head_impl.read.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar7 = &helloCmd.m_arguments.
              super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_head_impl.read;
    (*helloCmd.m_arguments.
      super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_head_impl.read.super__Function_base._M_manager)
              ((_Any_data *)pfVar7,(_Any_data *)pfVar7,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)helloCmd.m_arguments.
         super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
         ._M_head_impl.placeholder._M_dataplus._M_p !=
      &helloCmd.m_arguments.
       super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
       ._M_head_impl.placeholder.field_2) {
    operator_delete(helloCmd.m_arguments.
                    super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    ._M_head_impl.placeholder._M_dataplus._M_p,
                    helloCmd.m_arguments.
                    super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    ._M_head_impl.placeholder.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)helloCmd.m_footer._M_dataplus._M_p != &helloCmd.m_footer.field_2) {
    operator_delete(helloCmd.m_footer._M_dataplus._M_p,
                    helloCmd.m_footer.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)helloCmd.m_header._M_dataplus._M_p != &helloCmd.m_header.field_2) {
    operator_delete(helloCmd.m_header._M_dataplus._M_p,
                    helloCmd.m_header.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
try {
    // Create subcommands.
    auto const helloCmd = command<char>("subcmd hello")
        .argument<'n', std::string>("NAME")
        ;
    auto const addCmd = command<char>("subcmd add")
        .argument<'l', int>("LHS")
        .argument<'r', int>("RHS")
        ;

    // Create the main command.
    auto const cmd = command<char>("subcmd")
        // Add a subcommand.
        .subcommand<'H'>("hello", "hello command", helloCmd)
         // The template argument is the option identifier.
         // The 1st parameter is the subcommand name.
         // The 2nd parameter is the subcommand summary used in usage.
         // The 3rd parameter is the subcommand itself.

        // Add a subcommand.
        .subcommand<'A'>("add", "add command", addCmd)

        .flag<'h'>({'h'}, {"help"}, "", "produce help message", flag_type::exclusive)
         // flag_type::exclusive indicates that the subcommands are ignored when this flag is
         // specified.
        ;

    // Parse the command line.
    auto const opts = parse(argc, argv, cmd);

    if (opts.has<'h'>()) {
        std::cout << usage(cmd);
        return 0;
    }

    // Read the subcommands.
    if (opts.has<'H'>()) {
        // For subcommands, get() returns the option map of the subcommand.
        auto const helloOpts = opts.get<'H'>();
        auto const name = helloOpts.get<'n'>();
        std::cout << "Hello, " << name << "!\n";
    }
    else if (opts.has<'A'>()) {
        auto const addOpts = opts.get<'A'>();
        std::cout << addOpts.get<'l'>() + addOpts.get<'r'>() << "\n";
    }
} catch (error const &e) {
    std::cerr << e.message() << "\n";
}